

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::CompressionParameters> *
kj::_::tryExtractParameters
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,
          Vector<kj::ArrayPtr<const_char>_> *configuration,bool isAgreement)

{
  long lVar1;
  Array<kj::_::KeyMaybeVal> keyMaybeValuePairs;
  NullableValue<kj::CompressionParameters> _validConfig5067;
  Maybe<kj::_::UnverifiedConfig> maybeUnverified;
  ArrayPtr<kj::ArrayPtr<const_char>_> params;
  Array<kj::_::KeyMaybeVal> local_e0;
  NullableValue<kj::CompressionParameters> local_c8;
  NullableValue<kj::_::UnverifiedConfig> local_98;
  ArrayPtr<kj::ArrayPtr<const_char>_> local_58;
  NullableValue<kj::CompressionParameters> local_48;
  
  local_58.ptr = (configuration->builder).ptr;
  lVar1 = (long)(configuration->builder).pos - (long)local_58.ptr;
  if (lVar1 == 0x10) {
    local_98.isSet = false;
    local_98._1_1_ = 0;
    local_98.field_1.value.clientNoContextTakeover = false;
    local_98.field_1._16_1_ = 0;
    NullableValue<kj::CompressionParameters>::NullableValue
              (&__return_storage_ptr__->ptr,(CompressionParameters *)&local_98);
    return __return_storage_ptr__;
  }
  local_58.ptr = local_58.ptr + 1;
  local_58.size_ = (lVar1 >> 4) - 1;
  toKeysAndVals(&local_e0,&local_58);
  populateUnverifiedConfig((Maybe<kj::_::UnverifiedConfig> *)&local_98,&local_e0);
  if (local_98.isSet == true) {
    validateCompressionConfig
              ((Maybe<kj::CompressionParameters> *)&local_48,&local_98.field_1.value,isAgreement);
    NullableValue<kj::CompressionParameters>::NullableValue(&local_c8,&local_48);
    if (local_c8.isSet == true) {
      NullableValue<kj::CompressionParameters>::NullableValue
                (&__return_storage_ptr__->ptr,&local_c8.field_1.value);
      goto LAB_00397c4e;
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
LAB_00397c4e:
  Array<kj::_::KeyMaybeVal>::~Array(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

inline kj::Maybe<CompressionParameters> tryExtractParameters(
    kj::Vector<kj::ArrayPtr<const char>>& configuration,
    bool isAgreement) {
  // If the `configuration` is structured correctly and has no invalid parameters/values, we will
  // return a populated `CompressionParameters` struct.
  if (configuration.size() == 1) {
    // Plain `permessage-deflate`.
    return CompressionParameters{};
  }
  auto params = configuration.slice(1, configuration.size());
  auto keyMaybeValuePairs = toKeysAndVals(params);
  // Parse parameter strings into parameter[=value] pairs.
  auto maybeUnverified = populateUnverifiedConfig(keyMaybeValuePairs);
  KJ_IF_SOME(unverified, maybeUnverified) {
    // Parsing succeeded, i.e. the parameter (`key`) names are valid and we don't have
    // values for `x_no_context_takeover` parameters (the configuration is structured correctly).
    // All that's left is to check the `x_max_window_bits` values (if any are present).
    KJ_IF_SOME(validConfig, validateCompressionConfig(kj::mv(unverified), isAgreement)) {
      return kj::mv(validConfig);
    }
  }
  return kj::none;
}